

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::CodeHolder::newSection
          (CodeHolder *this,Section **sectionOut,char *name,size_t nameSize,SectionFlags flags,
          uint32_t alignment,int32_t order)

{
  ZoneAllocator *allocator;
  ZoneVector<asmjit::_abi_1_10::Section_*> *this_00;
  uint uVar1;
  uint *puVar2;
  Error EVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  Section *section;
  
  *sectionOut = (Section *)0x0;
  if (nameSize == 0xffffffffffffffff) {
    nameSize = strlen(name);
  }
  uVar5 = alignment + (alignment == 0);
  if ((uVar5 & uVar5 - 1) == 0) {
    if (nameSize < 0x24) {
      uVar1 = (this->_sections).super_ZoneVectorBase._size;
      if (uVar1 == 0xffffffff) {
        EVar3 = 0x14;
      }
      else {
        allocator = &this->_allocator;
        EVar3 = ZoneVector<asmjit::_abi_1_10::Section_*>::willGrow(&this->_sections,allocator,1);
        if (EVar3 == 0) {
          this_00 = &this->_sectionsByOrder;
          EVar3 = ZoneVector<asmjit::_abi_1_10::Section_*>::willGrow(this_00,allocator,1);
          if ((EVar3 == 0) &&
             (section = (Section *)ZoneAllocator::allocZeroed(allocator,0x68), EVar3 = 1,
             section != (Section *)0x0)) {
            section->_id = uVar1;
            section->_flags = flags;
            section->_alignment = uVar5;
            section->_order = order;
            memcpy(&section->_name,name,nameSize);
            puVar7 = (undefined8 *)(this->_sectionsByOrder).super_ZoneVectorBase._data;
            uVar6 = (ulong)(this->_sectionsByOrder).super_ZoneVectorBase._size;
            while (uVar4 = uVar6, 0 < (long)uVar4) {
              uVar6 = uVar4 >> 1;
              puVar2 = (uint *)puVar7[uVar6];
              uVar5 = puVar2[3];
              if (((int)uVar5 < order) || ((int)uVar5 <= order && *puVar2 < uVar1)) {
                puVar7 = puVar7 + uVar6 + 1;
                uVar6 = uVar4 + ~uVar6;
              }
            }
            ZoneVector<asmjit::_abi_1_10::Section_*>::appendUnsafe(&this->_sections,&section);
            ZoneVector<asmjit::_abi_1_10::Section_*>::insertUnsafe
                      (this_00,(long)puVar7 - (long)(this_00->super_ZoneVectorBase)._data >> 3,
                       &section);
            *sectionOut = section;
            EVar3 = 0;
          }
        }
      }
    }
    else {
      EVar3 = 0x15;
    }
  }
  else {
    EVar3 = 2;
  }
  return EVar3;
}

Assistant:

Error CodeHolder::newSection(Section** sectionOut, const char* name, size_t nameSize, SectionFlags flags, uint32_t alignment, int32_t order) noexcept {
  *sectionOut = nullptr;

  if (nameSize == SIZE_MAX)
    nameSize = strlen(name);

  if (alignment == 0)
    alignment = 1;

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(alignment)))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(nameSize > Globals::kMaxSectionNameSize))
    return DebugUtils::errored(kErrorInvalidSectionName);

  uint32_t sectionId = _sections.size();
  if (ASMJIT_UNLIKELY(sectionId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManySections);

  ASMJIT_PROPAGATE(_sections.willGrow(&_allocator));
  ASMJIT_PROPAGATE(_sectionsByOrder.willGrow(&_allocator));

  Section* section = _allocator.allocZeroedT<Section>();
  if (ASMJIT_UNLIKELY(!section))
    return DebugUtils::errored(kErrorOutOfMemory);

  section->_id = sectionId;
  section->_flags = flags;
  section->_alignment = alignment;
  section->_order = order;
  memcpy(section->_name.str, name, nameSize);

  Section** insertPosition = std::lower_bound(_sectionsByOrder.begin(), _sectionsByOrder.end(), section, [](const Section* a, const Section* b) {
    return std::make_tuple(a->order(), a->id()) < std::make_tuple(b->order(), b->id());
  });

  _sections.appendUnsafe(section);
  _sectionsByOrder.insertUnsafe((size_t)(insertPosition - _sectionsByOrder.data()), section);

  *sectionOut = section;
  return kErrorOk;
}